

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_by_extension(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  sVar3 = strlen(filename);
  iVar1 = strcmp(filename + (sVar3 - 4),".vtk");
  if (iVar1 == 0) {
    uVar2 = ref_export_vtk(ref_grid,filename);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0xaa0,"ref_export_by_extension",(ulong)uVar2,"vtk export failed");
      return uVar2;
    }
  }
  else {
    iVar1 = strcmp(filename + (sVar3 - 2),".c");
    if (iVar1 == 0) {
      uVar2 = ref_export_c(ref_grid,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xaa2,"ref_export_by_extension",(ulong)uVar2,"C export failed");
        return uVar2;
      }
    }
    else {
      iVar1 = strcmp(filename + (sVar3 - 4),".tec");
      if (iVar1 == 0) {
        uVar2 = ref_export_tec(ref_grid,filename);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0xaa4,"ref_export_by_extension",(ulong)uVar2,"tec export failed");
          return uVar2;
        }
      }
      else {
        iVar1 = strcmp(filename + (sVar3 - 4),".plt");
        if (iVar1 == 0) {
          uVar2 = ref_gather_by_extension(ref_grid,filename);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0xaa6,"ref_export_by_extension",(ulong)uVar2,"plt gather failed");
            return uVar2;
          }
        }
        else {
          iVar1 = strcmp(filename + (sVar3 - 4),".eps");
          if (iVar1 == 0) {
            uVar2 = ref_export_eps(ref_grid,filename);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0xaa8,"ref_export_by_extension",(ulong)uVar2,"eps export failed");
              return uVar2;
            }
          }
          else {
            iVar1 = strcmp(filename + (sVar3 - 4),".pdf");
            if (iVar1 == 0) {
              uVar2 = ref_export_pdf(ref_grid,filename);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0xaaa,"ref_export_by_extension",(ulong)uVar2,"pdf export failed");
                return uVar2;
              }
            }
            else {
              iVar1 = strcmp(filename + (sVar3 - 4),".su2");
              if (iVar1 == 0) {
                uVar2 = ref_export_su2(ref_grid,filename);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0xaac,"ref_export_by_extension",(ulong)uVar2,"su2 export failed");
                  return uVar2;
                }
              }
              else {
                iVar1 = strcmp(filename + (sVar3 - 10),".lb8.ugrid");
                if (iVar1 == 0) {
                  uVar2 = ref_export_bin_ugrid(ref_grid,filename,0,0);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0xaaf,"ref_export_by_extension",(ulong)uVar2,"lb8.ugrid export failed");
                    return uVar2;
                  }
                }
                else {
                  iVar1 = strcmp(filename + (sVar3 - 9),".b8.ugrid");
                  if (iVar1 == 0) {
                    uVar2 = ref_export_bin_ugrid(ref_grid,filename,1,0);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0xab2,"ref_export_by_extension",(ulong)uVar2,"b8.ugrid export failed")
                      ;
                      return uVar2;
                    }
                  }
                  else {
                    iVar1 = strcmp(filename + (sVar3 - 0xb),".lb8l.ugrid");
                    if (iVar1 == 0) {
                      uVar2 = ref_export_bin_ugrid(ref_grid,filename,0,1);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0xab5,"ref_export_by_extension",(ulong)uVar2,
                               "lb8l.ugrid export failed");
                        return uVar2;
                      }
                    }
                    else {
                      iVar1 = strcmp(filename + (sVar3 - 10),".b8l.ugrid");
                      if (iVar1 == 0) {
                        uVar2 = ref_export_bin_ugrid(ref_grid,filename,1,1);
                        if (uVar2 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0xab8,"ref_export_by_extension",(ulong)uVar2,
                                 "b8l.ugrid export failed");
                          return uVar2;
                        }
                      }
                      else {
                        iVar1 = strcmp(filename + (sVar3 - 0xc),".lb8.ugrid64");
                        if (iVar1 == 0) {
                          uVar2 = ref_export_bin_ugrid(ref_grid,filename,0,1);
                          if (uVar2 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                   ,0xabb,"ref_export_by_extension",(ulong)uVar2,
                                   "lb8.ugrid64 export failed");
                            return uVar2;
                          }
                        }
                        else {
                          iVar1 = strcmp(filename + (sVar3 - 0xb),".b8.ugrid64");
                          if (iVar1 == 0) {
                            uVar2 = ref_export_bin_ugrid(ref_grid,filename,1,1);
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0xabe,"ref_export_by_extension",(ulong)uVar2,
                                     "b8.ugrid64 export failed");
                              return uVar2;
                            }
                          }
                          else {
                            iVar1 = strcmp(filename + (sVar3 - 6),".ugrid");
                            if (iVar1 == 0) {
                              uVar2 = ref_export_ugrid(ref_grid,filename);
                              if (uVar2 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0xac0,"ref_export_by_extension",(ulong)uVar2,
                                       "ugrid export failed");
                                return uVar2;
                              }
                            }
                            else {
                              iVar1 = strcmp(filename + (sVar3 - 5),".grid");
                              if (iVar1 == 0) {
                                uVar2 = ref_export_i_like_cfd_grid(ref_grid,filename);
                                if (uVar2 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                         ,0xac2,"ref_export_by_extension",(ulong)uVar2,
                                         "grid export failed");
                                  return uVar2;
                                }
                              }
                              else {
                                iVar1 = strcmp(filename + (sVar3 - 5),".poly");
                                if (iVar1 == 0) {
                                  uVar2 = ref_export_poly(ref_grid,filename);
                                  if (uVar2 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                           ,0xac4,"ref_export_by_extension",(ulong)uVar2,
                                           "poly export failed");
                                    return uVar2;
                                  }
                                }
                                else {
                                  iVar1 = strcmp(filename + (sVar3 - 6),".smesh");
                                  if (iVar1 == 0) {
                                    uVar2 = ref_export_smesh(ref_grid,filename);
                                    if (uVar2 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                             ,0xac6,"ref_export_by_extension",(ulong)uVar2,
                                             "smesh export failed");
                                      return uVar2;
                                    }
                                  }
                                  else {
                                    iVar1 = strcmp(filename + (sVar3 - 6),".fgrid");
                                    if (iVar1 == 0) {
                                      uVar2 = ref_export_fgrid(ref_grid,filename);
                                      if (uVar2 != 0) {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                               ,0xac8,"ref_export_by_extension",(ulong)uVar2,
                                               "fgrid export failed");
                                        return uVar2;
                                      }
                                    }
                                    else {
                                      iVar1 = strcmp(filename + (sVar3 - 5),".html");
                                      if (iVar1 == 0) {
                                        uVar2 = ref_export_html(ref_grid,filename);
                                        if (uVar2 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                                 ,0xaca,"ref_export_by_extension",(ulong)uVar2,
                                                 "html export failed");
                                          return uVar2;
                                        }
                                      }
                                      else {
                                        iVar1 = strcmp(filename + (sVar3 - 6),".meshb");
                                        if (iVar1 == 0) {
                                          uVar2 = ref_export_meshb(ref_grid,filename);
                                          if (uVar2 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                                  ,0xacc,"ref_export_by_extension",(ulong)uVar2,
                                                  "meshb export failed");
                                            return uVar2;
                                          }
                                        }
                                        else {
                                          iVar1 = strcmp(filename + (sVar3 - 9),"-bamg.msh");
                                          if (iVar1 == 0) {
                                            uVar2 = ref_export_bamg_msh(ref_grid,filename);
                                            if (uVar2 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                                  ,0xace,"ref_export_by_extension",(ulong)uVar2,
                                                  "bamg msh export failed");
                                              return uVar2;
                                            }
                                          }
                                          else {
                                            iVar1 = strcmp(filename + (sVar3 - 4),".msh");
                                            if (iVar1 == 0) {
                                              uVar2 = ref_export_msh(ref_grid,filename);
                                              if (uVar2 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                                  ,0xad0,"ref_export_by_extension",(ulong)uVar2,
                                                  "msh export failed");
                                                return uVar2;
                                              }
                                            }
                                            else {
                                              iVar1 = strcmp(filename + (sVar3 - 5),".msh2");
                                              if (iVar1 == 0) {
                                                uVar2 = ref_export_msh2(ref_grid,filename);
                                                if (uVar2 != 0) {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                                  ,0xad2,"ref_export_by_extension",(ulong)uVar2,
                                                  "msh2 export failed");
                                                  return uVar2;
                                                }
                                              }
                                              else {
                                                iVar1 = strcmp(filename + (sVar3 - 4),".tri");
                                                if (iVar1 == 0) {
                                                  uVar2 = ref_export_tri(ref_grid,filename);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                                  ,0xad4,"ref_export_by_extension",(ulong)uVar2,
                                                  "tri export failed");
                                                  return uVar2;
                                                  }
                                                }
                                                else {
                                                  uVar2 = ref_gather_by_extension(ref_grid,filename)
                                                  ;
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                                  ,0xad6,"ref_export_by_extension",(ulong)uVar2,
                                                  "export via gather");
                                                  return uVar2;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_export_by_extension(REF_GRID ref_grid,
                                           const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 4], ".vtk") == 0) {
    RSS(ref_export_vtk(ref_grid, filename), "vtk export failed");
  } else if (strcmp(&filename[end_of_string - 2], ".c") == 0) {
    RSS(ref_export_c(ref_grid, filename), "C export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tec") == 0) {
    RSS(ref_export_tec(ref_grid, filename), "tec export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_by_extension(ref_grid, filename), "plt gather failed");
  } else if (strcmp(&filename[end_of_string - 4], ".eps") == 0) {
    RSS(ref_export_eps(ref_grid, filename), "eps export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".pdf") == 0) {
    RSS(ref_export_pdf(ref_grid, filename), "pdf export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".su2") == 0) {
    RSS(ref_export_su2(ref_grid, filename), "su2 export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_FALSE),
        "lb8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_FALSE),
        "b8.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8l.ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_FALSE, REF_TRUE),
        "lb8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_export_bin_ugrid(ref_grid, filename, REF_TRUE, REF_TRUE),
        "b8.ugrid64 export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".ugrid") == 0) {
    RSS(ref_export_ugrid(ref_grid, filename), "ugrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".grid") == 0) {
    RSS(ref_export_i_like_cfd_grid(ref_grid, filename), "grid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".poly") == 0) {
    RSS(ref_export_poly(ref_grid, filename), "poly export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".smesh") == 0) {
    RSS(ref_export_smesh(ref_grid, filename), "smesh export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".fgrid") == 0) {
    RSS(ref_export_fgrid(ref_grid, filename), "fgrid export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".html") == 0) {
    RSS(ref_export_html(ref_grid, filename), "html export failed");
  } else if (strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_export_meshb(ref_grid, filename), "meshb export failed");
  } else if (strcmp(&filename[end_of_string - 9], "-bamg.msh") == 0) {
    RSS(ref_export_bamg_msh(ref_grid, filename), "bamg msh export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".msh") == 0) {
    RSS(ref_export_msh(ref_grid, filename), "msh export failed");
  } else if (strcmp(&filename[end_of_string - 5], ".msh2") == 0) {
    RSS(ref_export_msh2(ref_grid, filename), "msh2 export failed");
  } else if (strcmp(&filename[end_of_string - 4], ".tri") == 0) {
    RSS(ref_export_tri(ref_grid, filename), "tri export failed");
  } else {
    RSS(ref_gather_by_extension(ref_grid, filename), "export via gather");
  }

  return REF_SUCCESS;
}